

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forced_max_frame_width_height_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_a7a3ee::EncodeForcedMaxFrameWidthHeight_SecondFrameTooBig_Test::TestBody
          (EncodeForcedMaxFrameWidthHeight_SecondFrameTooBig_Test *this)

{
  bool bVar1;
  Type type;
  aom_codec_err_t line;
  aom_codec_err_t aVar2;
  pointer __s;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  aom_image_t img;
  AssertionResult gtest_ar_2;
  aom_codec_ctx_t enc;
  AssertionResult gtest_ar_1;
  aom_codec_enc_cfg_t cfg;
  aom_codec_iface_t *iface;
  AssertionResult gtest_ar;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> img_data;
  size_t kImageDataSize;
  aom_codec_ctx_t *in_stack_fffffffffffff9b8;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c8;
  undefined4 in_stack_fffffffffffff9cc;
  aom_codec_iface_t *in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d8;
  int in_stack_fffffffffffff9dc;
  aom_codec_enc_cfg_t *in_stack_fffffffffffff9e0;
  uint in_stack_fffffffffffff9e8;
  Type in_stack_fffffffffffff9ec;
  aom_image_t *in_stack_fffffffffffff9f0;
  Message *message;
  AssertHelper *in_stack_fffffffffffffa40;
  AssertionResult local_5a8 [2];
  aom_codec_err_t local_588;
  undefined4 local_584;
  AssertionResult local_580 [2];
  Type local_560;
  undefined4 local_55c;
  AssertionResult local_558 [2];
  aom_image_t *local_538;
  undefined1 *local_530;
  AssertionResult local_528;
  undefined1 local_518 [184];
  aom_codec_err_t local_460;
  undefined4 local_45c;
  AssertionResult local_458 [5];
  aom_codec_err_t local_400;
  undefined4 local_3fc;
  AssertionResult local_3f8;
  undefined4 local_3dc;
  undefined4 local_3d8;
  undefined4 local_3d0;
  undefined4 local_3cc;
  aom_codec_iface_t *local_60;
  uint local_54;
  undefined8 local_30;
  AssertionResult local_28;
  Message local_18;
  undefined8 local_10;
  
  local_10 = 0x18000;
  operator_new__(0x18000);
  message = &local_18;
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
            (in_stack_fffffffffffff9c0,(uchar *)in_stack_fffffffffffff9b8);
  local_30 = 0;
  testing::internal::
  CmpHelperNE<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,decltype(nullptr)>
            ((char *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
             (char *)in_stack_fffffffffffff9d0,
             (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
             (void **)in_stack_fffffffffffff9c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff9f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x833453);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
               (char *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
               (char *)in_stack_fffffffffffff9d0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffa40,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9c0);
    testing::Message::~Message((Message *)0x8334b0);
  }
  local_54 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x833537);
  if (local_54 == 0) {
    __s = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                    (in_stack_fffffffffffff9c0);
    memset(__s,0x80,0x18000);
    local_60 = aom_codec_av1_cx();
    local_3fc = 0;
    local_400 = aom_codec_enc_config_default
                          (in_stack_fffffffffffff9d0,
                           (aom_codec_enc_cfg_t *)
                           CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                           (uint)((ulong)in_stack_fffffffffffff9c0 >> 0x20));
    testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
               (char *)in_stack_fffffffffffff9d0,
               (aom_codec_err_t *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
               (aom_codec_err_t *)in_stack_fffffffffffff9c0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3f8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff9f0);
      testing::AssertionResult::failure_message((AssertionResult *)0x833629);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                 (char *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                 (char *)in_stack_fffffffffffff9d0);
      testing::internal::AssertHelper::operator=(in_stack_fffffffffffffa40,message);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9c0);
      testing::Message::~Message((Message *)0x833686);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x8336f7);
    local_3dc = 0x80;
    local_3d8 = 0x80;
    local_3d0 = 0xff;
    local_3cc = 0x100;
    local_45c = 0;
    local_460 = aom_codec_enc_init_ver
                          ((aom_codec_ctx_t *)in_stack_fffffffffffff9f0,
                           (aom_codec_iface_t *)
                           CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                           in_stack_fffffffffffff9e0,
                           CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                           (int)((ulong)in_stack_fffffffffffff9d0 >> 0x20));
    testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
               (char *)in_stack_fffffffffffff9d0,
               (aom_codec_err_t *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
               (aom_codec_err_t *)in_stack_fffffffffffff9c0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_458);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff9f0);
      testing::AssertionResult::failure_message((AssertionResult *)0x8337d9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                 (char *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                 (char *)in_stack_fffffffffffff9d0);
      testing::internal::AssertHelper::operator=(in_stack_fffffffffffffa40,message);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9c0);
      testing::Message::~Message((Message *)0x833836);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x8338a7);
    local_530 = local_518;
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
              (in_stack_fffffffffffff9c0);
    local_538 = aom_img_wrap(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                             in_stack_fffffffffffff9e8,
                             (uint)((ulong)in_stack_fffffffffffff9e0 >> 0x20),
                             (uint)in_stack_fffffffffffff9e0,
                             (uchar *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8))
    ;
    testing::internal::EqHelper::Compare<aom_image_*,_aom_image_*,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
               (char *)in_stack_fffffffffffff9d0,
               (aom_image **)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
               (aom_image **)in_stack_fffffffffffff9c0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_528);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff9f0);
      in_stack_fffffffffffff9f0 =
           (aom_image_t *)testing::AssertionResult::failure_message((AssertionResult *)0x83396f);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                 (char *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                 (char *)in_stack_fffffffffffff9d0);
      testing::internal::AssertHelper::operator=(in_stack_fffffffffffffa40,message);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9c0);
      testing::Message::~Message((Message *)0x8339cc);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x833a3d);
    local_55c = 0;
    type = aom_codec_encode((aom_codec_ctx_t *)in_stack_fffffffffffff9f0,
                            (aom_image_t *)
                            CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                            (aom_codec_pts_t)in_stack_fffffffffffff9e0,
                            CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                            (aom_enc_frame_flags_t)in_stack_fffffffffffff9d0);
    local_560 = type;
    testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
               (char *)in_stack_fffffffffffff9d0,
               (aom_codec_err_t *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
               (aom_codec_err_t *)in_stack_fffffffffffff9c0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_558);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff9f0);
      in_stack_fffffffffffff9e0 =
           (aom_codec_enc_cfg_t *)
           testing::AssertionResult::failure_message((AssertionResult *)0x833aee);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff9f0,type,(char *)in_stack_fffffffffffff9e0,
                 in_stack_fffffffffffff9dc,(char *)in_stack_fffffffffffff9d0);
      testing::internal::AssertHelper::operator=(in_stack_fffffffffffffa40,message);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9c0);
      testing::Message::~Message((Message *)0x833b4b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x833bbc);
    local_3dc = 0x100;
    local_3d8 = 0x100;
    local_584 = 8;
    line = aom_codec_enc_config_set
                     ((aom_codec_ctx_t *)in_stack_fffffffffffff9d0,
                      (aom_codec_enc_cfg_t *)
                      CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    local_588 = line;
    testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
              ((char *)CONCAT44(line,in_stack_fffffffffffff9d8),(char *)in_stack_fffffffffffff9d0,
               (aom_codec_err_t *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
               (aom_codec_err_t *)in_stack_fffffffffffff9c0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_580);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff9f0);
      in_stack_fffffffffffff9d0 =
           (aom_codec_iface_t *)
           testing::AssertionResult::failure_message((AssertionResult *)0x833c76);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff9f0,type,(char *)in_stack_fffffffffffff9e0,
                 line,(char *)in_stack_fffffffffffff9d0);
      testing::internal::AssertHelper::operator=(in_stack_fffffffffffffa40,message);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9c0);
      testing::Message::~Message((Message *)0x833cd3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x833d41);
    aVar2 = aom_codec_destroy(in_stack_fffffffffffff9b8);
    testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
              ((char *)CONCAT44(line,in_stack_fffffffffffff9d8),(char *)in_stack_fffffffffffff9d0,
               (aom_codec_err_t *)CONCAT44(aVar2,in_stack_fffffffffffff9c8),
               (aom_codec_err_t *)in_stack_fffffffffffff9c0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5a8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff9f0);
      in_stack_fffffffffffff9c0 =
           (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
           testing::AssertionResult::failure_message((AssertionResult *)0x833ddd);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffff9f0,type,(char *)in_stack_fffffffffffff9e0,
                 line,(char *)in_stack_fffffffffffff9d0);
      testing::internal::AssertHelper::operator=(in_stack_fffffffffffffa40,message);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9c0);
      testing::Message::~Message((Message *)0x833e3a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x833ea5);
    local_54 = 0;
  }
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            (in_stack_fffffffffffff9c0);
  return;
}

Assistant:

TEST(EncodeForcedMaxFrameWidthHeight, SecondFrameTooBig) {
  // A buffer of gray samples. Large enough for 128x128 and 256x256, YUV 4:2:0.
  constexpr size_t kImageDataSize = 256 * 256 + 2 * 128 * 128;
  std::unique_ptr<unsigned char[]> img_data(new unsigned char[kImageDataSize]);
  ASSERT_NE(img_data, nullptr);
  memset(img_data.get(), 128, kImageDataSize);

  aom_codec_iface_t *iface = aom_codec_av1_cx();
  aom_codec_enc_cfg_t cfg;
  EXPECT_EQ(AOM_CODEC_OK,
            aom_codec_enc_config_default(iface, &cfg, AOM_USAGE_REALTIME));
  cfg.g_w = 128;
  cfg.g_h = 128;
  cfg.g_forced_max_frame_width = 255;
  cfg.g_forced_max_frame_height = 256;
  aom_codec_ctx_t enc;
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_enc_init(&enc, iface, &cfg, 0));

  aom_image_t img;
  EXPECT_EQ(&img,
            aom_img_wrap(&img, AOM_IMG_FMT_I420, 128, 128, 1, img_data.get()));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_encode(&enc, &img, 0, 1, 0));

  cfg.g_w = 256;
  cfg.g_h = 256;
  EXPECT_EQ(AOM_CODEC_INVALID_PARAM, aom_codec_enc_config_set(&enc, &cfg));

  EXPECT_EQ(AOM_CODEC_OK, aom_codec_destroy(&enc));
}